

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

AffineSpace3fa * __thiscall
embree::CoronaLoader::load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
          (CoronaLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long *in_RDX;
  AffineSpace3fa *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  float local_2dc;
  float local_2d8;
  float local_2d4;
  float local_2d0;
  undefined1 local_2cc [3];
  bool bVar8;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  float local_2c0;
  float local_2bc;
  undefined8 local_2b8;
  ulong uStack_2b0;
  undefined8 local_2a8;
  ulong uStack_2a0;
  undefined8 local_298;
  ulong uStack_290;
  undefined1 local_285;
  ParseLocation *in_stack_fffffffffffffd88;
  string local_258 [32];
  long *local_238;
  long *local_220;
  long *local_218;
  long *local_210;
  long *local_208;
  long *local_200;
  long *local_1f8;
  long *local_1f0;
  long *local_1e8;
  long *local_1e0;
  long *local_1d8;
  long *local_1d0;
  long *local_1c8;
  long *local_1c0;
  float *local_198;
  float *local_190;
  float *local_188;
  float *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  float *local_160;
  float *local_158;
  undefined8 *local_150;
  float local_144;
  float local_140;
  float local_13c;
  undefined8 *local_138;
  float local_12c;
  float local_128;
  float local_124;
  undefined8 *local_120;
  float local_110;
  float local_10c;
  undefined8 *local_108;
  undefined8 local_e8;
  ulong uStack_e0;
  float local_d8;
  float local_d4;
  undefined4 local_cc;
  undefined8 local_c8;
  ulong uStack_c0;
  float local_b8;
  float local_b4;
  float local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  ulong uStack_a0;
  float local_98;
  float local_94;
  float local_90;
  undefined4 local_8c;
  
  bVar8 = SUB41((uint)_local_2cc >> 0x18,0);
  local_238 = in_RDX;
  sVar2 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98));
  if (sVar2 != 0xc) {
    local_285 = 1;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    local_1c0 = local_238;
    ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffd88);
    std::operator+(__lhs,(char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    std::runtime_error::runtime_error((runtime_error *)__lhs,local_258);
    local_285 = 0;
    __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1c8 = local_238;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_238 + 0x98),0);
  local_2bc = Token::Float((Token *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                           bVar8);
  local_1d0 = local_238;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_238 + 0x98),1);
  local_2c0 = Token::Float((Token *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                           bVar8);
  local_1d8 = local_238;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_238 + 0x98),2);
  fVar3 = Token::Float((Token *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),bVar8)
  ;
  local_1e0 = local_238;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_238 + 0x98),4);
  fVar4 = Token::Float((Token *)CONCAT44(fVar3,in_stack_fffffffffffffd38),bVar8);
  local_1e8 = local_238;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_238 + 0x98),5);
  _local_2cc = Token::Float((Token *)CONCAT44(fVar3,fVar4),bVar8);
  local_1f0 = local_238;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_238 + 0x98),6);
  fVar5 = _local_2cc;
  bVar8 = SUB41((uint)_local_2cc >> 0x18,0);
  bVar1 = bVar8;
  _local_2cc = fVar5;
  local_2d0 = Token::Float((Token *)CONCAT44(fVar3,fVar4),bVar1);
  local_1f8 = local_238;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_238 + 0x98),8);
  fVar5 = _local_2cc;
  bVar8 = SUB41((uint)_local_2cc >> 0x18,0);
  bVar1 = bVar8;
  _local_2cc = fVar5;
  local_2d4 = Token::Float((Token *)CONCAT44(fVar3,fVar4),bVar1);
  local_200 = local_238;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_238 + 0x98),9);
  fVar5 = _local_2cc;
  bVar8 = SUB41((uint)_local_2cc >> 0x18,0);
  bVar1 = bVar8;
  _local_2cc = fVar5;
  local_2d8 = Token::Float((Token *)CONCAT44(fVar3,fVar4),bVar1);
  local_208 = local_238;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_238 + 0x98),10);
  fVar5 = _local_2cc;
  bVar8 = SUB41((uint)_local_2cc >> 0x18,0);
  bVar1 = bVar8;
  _local_2cc = fVar5;
  fVar5 = Token::Float((Token *)CONCAT44(fVar3,fVar4),bVar1);
  local_150 = &local_2b8;
  local_158 = &local_2bc;
  local_160 = &local_2c0;
  local_168 = &stack0xfffffffffffffd3c;
  local_170 = &stack0xfffffffffffffd38;
  local_178 = local_2cc;
  local_180 = &local_2d0;
  local_188 = &local_2d4;
  local_190 = &local_2d8;
  local_198 = &local_2dc;
  local_13c = local_2bc;
  local_144 = local_2d4;
  local_8c = 0;
  local_a8 = CONCAT44(fVar4,local_2bc);
  uStack_a0 = (ulong)(uint)local_2d4;
  local_120 = &local_2a8;
  local_124 = local_2c0;
  local_128 = _local_2cc;
  local_12c = local_2d8;
  local_ac = 0;
  local_c8 = CONCAT44(_local_2cc,local_2c0);
  uStack_c0 = (ulong)(uint)local_2d8;
  local_108 = &local_298;
  local_110 = local_2d0;
  local_cc = 0;
  local_e8 = CONCAT44(local_2d0,fVar3);
  uStack_e0 = (ulong)(uint)local_2dc;
  local_210 = local_238;
  local_2dc = fVar5;
  local_140 = fVar4;
  local_138 = local_150;
  local_10c = fVar3;
  local_d8 = fVar3;
  local_d4 = local_110;
  local_b8 = local_124;
  local_b4 = local_128;
  local_b0 = local_12c;
  local_98 = local_13c;
  local_94 = fVar4;
  local_90 = local_144;
  local_2b8 = local_a8;
  uStack_2b0 = uStack_a0;
  local_2a8 = local_c8;
  uStack_2a0 = uStack_c0;
  local_298 = local_e8;
  uStack_290 = uStack_e0;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_238 + 0x98),3);
  fVar5 = _local_2cc;
  bVar8 = SUB41((uint)_local_2cc >> 0x18,0);
  bVar1 = bVar8;
  _local_2cc = fVar5;
  fVar6 = Token::Float((Token *)CONCAT44(fVar3,fVar4),bVar1);
  local_218 = local_238;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_238 + 0x98),7);
  fVar5 = _local_2cc;
  bVar8 = SUB41((uint)_local_2cc >> 0x18,0);
  bVar1 = bVar8;
  _local_2cc = fVar5;
  fVar7 = Token::Float((Token *)CONCAT44(fVar3,fVar4),bVar1);
  local_220 = local_238;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_238 + 0x98),0xb);
  fVar5 = _local_2cc;
  bVar8 = SUB41((uint)_local_2cc >> 0x18,0);
  bVar1 = bVar8;
  _local_2cc = fVar5;
  fVar5 = Token::Float((Token *)CONCAT44(fVar3,fVar4),bVar1);
  *(undefined8 *)&(in_RDI->l).vx.field_0 = local_2b8;
  *(ulong *)((long)&(in_RDI->l).vx.field_0 + 8) = uStack_2b0;
  *(undefined8 *)&(in_RDI->l).vy.field_0 = local_2a8;
  *(ulong *)((long)&(in_RDI->l).vy.field_0 + 8) = uStack_2a0;
  *(undefined8 *)&(in_RDI->l).vz.field_0 = local_298;
  *(ulong *)((long)&(in_RDI->l).vz.field_0 + 8) = uStack_290;
  *(ulong *)&(in_RDI->p).field_0 = CONCAT44(fVar7,fVar6);
  *(ulong *)((long)&(in_RDI->p).field_0 + 8) = (ulong)(uint)fVar5;
  return in_RDI;
}

Assistant:

AffineSpace3fa CoronaLoader::load<AffineSpace3fa>(const Ref<XML>& xml) 
  {
    if (xml->body.size() != 12) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong AffineSpace body");
    return AffineSpace3fa(LinearSpace3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[ 2].Float(),
                                         xml->body[4].Float(),xml->body[5].Float(),xml->body[ 6].Float(),
                                         xml->body[8].Float(),xml->body[9].Float(),xml->body[10].Float()),
                          Vec3fa(xml->body[3].Float(),xml->body[7].Float(),xml->body[11].Float()));
  }